

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::makeController(MidiMessage *this,int channel,int num,int value)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  uStack_28 = CONCAT17((char)channel,(undefined7)uStack_28) & 0xfffffffffffffff | 0xb000000000000000
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 7));
  uStack_28 = CONCAT17(uStack_28._7_1_,CONCAT16((char)num,(undefined6)uStack_28)) &
              0xff7fffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 6));
  uStack_28 = CONCAT26(uStack_28._6_2_,CONCAT15((char)value,(undefined5)uStack_28)) &
              0xffff7fffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
             (uchar *)((long)&uStack_28 + 5));
  return;
}

Assistant:

void MidiMessage::makeController(int channel, int num, int value) {
	resize(0);
	push_back(0xb0 | (0x0f & channel));
	push_back(0x7f & num);
	push_back(0x7f & value);
}